

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_ToggleMap(void)

{
  if ((gamestate == GS_LEVEL) && ((dmflags2.Value._2_1_ & 4) == 0)) {
    ST_SetNeedRefresh();
    if (automapactive != false) {
      if ((am_overlay.Value == 1) && (viewactive == true)) {
        viewactive = false;
        ST_SetNeedRefresh();
        return;
      }
      AM_Stop();
      return;
    }
    AM_Start();
    viewactive = am_overlay.Value != 0;
  }
  return;
}

Assistant:

void AM_ToggleMap ()
{
	if (gamestate != GS_LEVEL)
		return;

	// Don't activate the automap if we're not allowed to use it.
	if (dmflags2 & DF2_NO_AUTOMAP)
		return;

	ST_SetNeedRefresh();
	if (!automapactive)
	{
		AM_Start ();
		viewactive = (am_overlay != 0.f);
	}
	else
	{
		if (am_overlay==1 && viewactive)
		{
			viewactive = false;
			ST_SetNeedRefresh();
		}
		else
		{
			AM_Stop ();
		}
	}
}